

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_MULUB(void)

{
  bool bVar1;
  int local_18 [2];
  int e [3];
  Z80Reg reg;
  
  e[0] = -1;
  local_18[1] = 0xffffffff;
  local_18[0] = -1;
  e[1] = GetRegister(&::lp);
  if ((e[1] == Z80_A) && (bVar1 = comma(&::lp), bVar1)) {
    e[1] = GetRegister(&::lp);
  }
  switch(e[1]) {
  case 0:
    local_18[0] = 0xed;
    local_18[1] = 0xc1;
    break;
  case 1:
    local_18[0] = 0xed;
    local_18[1] = 0xc9;
    break;
  case 2:
    local_18[0] = 0xed;
    local_18[1] = 0xd1;
    break;
  case 3:
    local_18[0] = 0xed;
    local_18[1] = 0xd9;
  }
  EmitBytes(local_18,true);
  return;
}

Assistant:

static void OpCode_MULUB() {
		Z80Reg reg;
		int e[3];
		e[0] = e[1] = e[2] = -1;
		if ((reg = GetRegister(lp)) == Z80_A && comma(lp)) {
			reg = GetRegister(lp);
		}
		switch (reg) {
		case Z80_B:
			e[0] = 0xed; e[1] = 0xc1; break;
		case Z80_C:
			e[0] = 0xed; e[1] = 0xc9; break;
		case Z80_D:
			e[0] = 0xed; e[1] = 0xd1; break;
		case Z80_E:
			e[0] = 0xed; e[1] = 0xd9; break;
		default:
			;
		}
		EmitBytes(e, true);
	}